

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

ParseNode *
VisitBlock<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
          (ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,
          _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *prefix,
          _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *postfix,ParseNode *pnodeParent)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  Type *ppFVar4;
  ParseNodeBin *pPVar5;
  ParseNodeStmt *pPVar6;
  ParseNodePtr local_38;
  
  if (pnode == (ParseNode *)0x0) {
    local_38 = (ParseNode *)0x0;
  }
  else {
    if ((byteCodeGenerator->isBinding == true) && ((byteCodeGenerator->flags & 2) != 0)) {
      ppFVar4 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                          (&byteCodeGenerator->funcInfoStack->
                            super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
      bVar2 = FuncInfo::IsGlobalFunction(*ppFVar4);
    }
    else {
      bVar2 = false;
    }
    if (pnode->nop == knopList) {
      local_38 = (ParseNodePtr)0x0;
      do {
        pPVar5 = ParseNode::AsParseNodeBin(pnode);
        Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                  (pPVar5->pnode1,byteCodeGenerator,prefix,postfix,pnodeParent);
        if (bVar2 != false) {
          pPVar5 = ParseNode::AsParseNodeBin(pnode);
          bVar1 = MustProduceValue(pPVar5->pnode1,byteCodeGenerator->scriptContext);
          if (bVar1) {
            pPVar5 = ParseNode::AsParseNodeBin(pnode);
            local_38 = pPVar5->pnode1;
          }
          pPVar5 = ParseNode::AsParseNodeBin(pnode);
          uVar3 = pPVar5->pnode1->nop - 0x5b;
          if (uVar3 < 0x15) {
            if ((0x1af2ffU >> (uVar3 & 0x1f) & 1) == 0) {
              uVar3 = 0x50c00 >> (uVar3 & 0x1f);
            }
            else {
              pPVar6 = ParseNode::AsParseNodeStmt(pPVar5->pnode1);
              uVar3 = pPVar6->grfnop >> 9;
            }
            if ((uVar3 & 1) != 0) {
              bVar2 = false;
            }
          }
        }
        pPVar5 = ParseNode::AsParseNodeBin(pnode);
        pnode = pPVar5->pnode2;
      } while (pnode->nop == knopList);
    }
    else {
      local_38 = (ParseNodePtr)0x0;
    }
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pnode,byteCodeGenerator,prefix,postfix,pnodeParent);
    if ((bVar2 != false) &&
       (bVar2 = MustProduceValue(pnode,byteCodeGenerator->scriptContext), bVar2)) {
      local_38 = pnode;
    }
  }
  return local_38;
}

Assistant:

ParseNode* VisitBlock(ParseNode *pnode, ByteCodeGenerator* byteCodeGenerator, PrefixFn prefix, PostfixFn postfix, ParseNode *pnodeParent = nullptr)
{
    ParseNode *pnodeLastVal = nullptr;
    if (pnode != nullptr)
    {
        bool fTrackVal = byteCodeGenerator->IsBinding() &&
            (byteCodeGenerator->GetFlags() & fscrReturnExpression) &&
            byteCodeGenerator->TopFuncInfo()->IsGlobalFunction();
        while (pnode->nop == knopList)
        {
            Visit(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator, prefix, postfix, pnodeParent);
            if (fTrackVal)
            {
                // If we're tracking values, find the last statement (if any) in the block that is
                // guaranteed to produce a value.
                if (MustProduceValue(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator->GetScriptContext()))
                {
                    pnodeLastVal = pnode->AsParseNodeBin()->pnode1;
                }
                if (IsJump(pnode->AsParseNodeBin()->pnode1))
                {
                    // This is a jump out of the current block. The remaining instructions (if any)
                    // will not be executed, so stop tracking them.
                    fTrackVal = false;
                }
            }
            pnode = pnode->AsParseNodeBin()->pnode2;
        }
        Visit(pnode, byteCodeGenerator, prefix, postfix, pnodeParent);
        if (fTrackVal)
        {
            if (MustProduceValue(pnode, byteCodeGenerator->GetScriptContext()))
            {
                pnodeLastVal = pnode;
            }
        }
    }
    return pnodeLastVal;
}